

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t vbmi2_256_despace(char *bytes,size_t howmany)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  auVar8[8] = 0x20;
  auVar8._0_8_ = 0x2020202020202020;
  auVar8[9] = 0x20;
  auVar8[10] = 0x20;
  auVar8[0xb] = 0x20;
  auVar8[0xc] = 0x20;
  auVar8[0xd] = 0x20;
  auVar8[0xe] = 0x20;
  auVar8[0xf] = 0x20;
  auVar8[0x10] = 0x20;
  auVar8[0x11] = 0x20;
  auVar8[0x12] = 0x20;
  auVar8[0x13] = 0x20;
  auVar8[0x14] = 0x20;
  auVar8[0x15] = 0x20;
  auVar8[0x16] = 0x20;
  auVar8[0x17] = 0x20;
  auVar8[0x18] = 0x20;
  auVar8[0x19] = 0x20;
  auVar8[0x1a] = 0x20;
  auVar8[0x1b] = 0x20;
  auVar8[0x1c] = 0x20;
  auVar8[0x1d] = 0x20;
  auVar8[0x1e] = 0x20;
  auVar8[0x1f] = 0x20;
  auVar9[8] = 10;
  auVar9._0_8_ = 0xa0a0a0a0a0a0a0a;
  auVar9[9] = 10;
  auVar9[10] = 10;
  auVar9[0xb] = 10;
  auVar9[0xc] = 10;
  auVar9[0xd] = 10;
  auVar9[0xe] = 10;
  auVar9[0xf] = 10;
  auVar9[0x10] = 10;
  auVar9[0x11] = 10;
  auVar9[0x12] = 10;
  auVar9[0x13] = 10;
  auVar9[0x14] = 10;
  auVar9[0x15] = 10;
  auVar9[0x16] = 10;
  auVar9[0x17] = 10;
  auVar9[0x18] = 10;
  auVar9[0x19] = 10;
  auVar9[0x1a] = 10;
  auVar9[0x1b] = 10;
  auVar9[0x1c] = 10;
  auVar9[0x1d] = 10;
  auVar9[0x1e] = 10;
  auVar9[0x1f] = 10;
  auVar10[8] = 0xd;
  auVar10._0_8_ = 0xd0d0d0d0d0d0d0d;
  auVar10[9] = 0xd;
  auVar10[10] = 0xd;
  auVar10[0xb] = 0xd;
  auVar10[0xc] = 0xd;
  auVar10[0xd] = 0xd;
  auVar10[0xe] = 0xd;
  auVar10[0xf] = 0xd;
  auVar10[0x10] = 0xd;
  auVar10[0x11] = 0xd;
  auVar10[0x12] = 0xd;
  auVar10[0x13] = 0xd;
  auVar10[0x14] = 0xd;
  auVar10[0x15] = 0xd;
  auVar10[0x16] = 0xd;
  auVar10[0x17] = 0xd;
  auVar10[0x18] = 0xd;
  auVar10[0x19] = 0xd;
  auVar10[0x1a] = 0xd;
  auVar10[0x1b] = 0xd;
  auVar10[0x1c] = 0xd;
  auVar10[0x1d] = 0xd;
  auVar10[0x1e] = 0xd;
  auVar10[0x1f] = 0xd;
  uVar5 = 0;
  sVar4 = 0;
  while (uVar5 + 0x1f < howmany) {
    auVar7 = *(undefined1 (*) [32])(bytes + uVar5);
    uVar5 = uVar5 + 0x20;
    uVar2 = vpcmpb_avx512vl(auVar7,auVar8,4);
    uVar3 = vpcmpb_avx512vl(auVar7,auVar9,4);
    uVar6 = vpcmpb_avx512vl(auVar7,auVar10,4);
    uVar6 = uVar2 & uVar3 & uVar6;
    auVar7 = vpcompressw_avx512_vbmi2(auVar7,uVar6);
    *(undefined1 (*) [32])(bytes + sVar4) = auVar7;
    sVar4 = sVar4 + (uint)POPCOUNT((int)uVar6);
  }
  for (; uVar5 < howmany; uVar5 = uVar5 + 1) {
    bVar1 = bytes[uVar5];
    if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      bytes[sVar4] = bVar1;
      sVar4 = sVar4 + 1;
    }
  }
  return sVar4;
}

Assistant:

size_t vbmi2_256_despace(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m256i spaces = _mm256_set1_epi8(' ');
  __m256i newline = _mm256_set1_epi8('\n');
  __m256i carriage = _mm256_set1_epi8('\r');
  size_t i = 0;
  for (; i + 31 < howmany; i += 32) {
    __m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
    __mmask32  notspaces = _mm256_cmpneq_epi8_mask (x, spaces);
    __mmask32  notnewline = _mm256_cmpneq_epi8_mask (x, newline);
    __mmask32  notcarriage = _mm256_cmpneq_epi8_mask (x, carriage);
    __mmask32  notwhite = notspaces & notnewline & notcarriage;
    _mm256_mask_compressstoreu_epi16  (bytes + pos, notwhite, x);
    pos += _popcnt32(notwhite);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}